

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
stringToUnits_addition_Test::~stringToUnits_addition_Test(stringToUnits_addition_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, addition)
{
    auto u1 = unit_from_string("cm+cm");
    EXPECT_EQ(u1, precise_unit(2, precise::cm));

    u1 = unit_from_string("km + m+ cm+mm");
    EXPECT_EQ(u1, precise_unit(1001.011, precise::m));
    u1 = unit_from_string("kilometer+ 3in");
    EXPECT_EQ(u1, (1.0 * precise::km + 3.0 * precise::in).as_unit());

    u1 = unit_from_string("km+  7.0 feet");
    EXPECT_EQ(u1, (1.0 * precise::km + 7.0 * precise::ft).as_unit());
    u1 = unit_from_string("m*km+  ft*in");
    EXPECT_EQ(
        u1,
        (1.0 * precise::km * precise::m + 1.0 * precise::ft * precise::in)
            .as_unit());

    u1 = unit_from_string("meter + hippyhoppy");
    EXPECT_FALSE(is_valid(u1));

    u1 = unit_from_string("hippyhoppy + meter");
    EXPECT_FALSE(is_valid(u1));

    u1 = unit_from_string("arggh + kilometer");
    EXPECT_FALSE(is_valid(u1));

    u1 = unit_from_string("kilometer + arggh");
    EXPECT_FALSE(is_valid(u1));

    u1 = unit_from_string("meter + kg");
    EXPECT_EQ(u1, precise::m * precise::kg);
}